

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

void __thiscall
BinaryReaderTest_ReadUInt_Test::~BinaryReaderTest_ReadUInt_Test
          (BinaryReaderTest_ReadUInt_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BinaryReaderTest, ReadUInt) {
  int data[] = {11, -22, 0};
  mp::NLStringRef str(reinterpret_cast<char*>(data), sizeof(data) - 1);
  TestBinaryReader<> reader(str);
  EXPECT_EQ(11, reader.ReadUInt());
  std::string message =
      fmt::format("test:offset {}: expected unsigned integer", sizeof(int));
  EXPECT_THROW_MSG(reader.ReadUInt(), mp::BinaryReadError, message);
  ChangeEndianness(data[0]);
  EXPECT_EQ(11, TestBinaryReader<EndiannessConverter>(str).ReadUInt());
}